

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O2

long __thiscall
Imath_3_2::Frustum<float>::DepthToZ(Frustum<float> *this,float depth,long zmin,long zmax)

{
  float fVar1;
  float fVar2;
  
  fVar2 = this->_nearPlane;
  fVar1 = this->_farPlane;
  if (this->_orthographic == true) {
    fVar2 = 1.0 - (depth + depth + fVar1 + fVar2) / (fVar1 - fVar2);
  }
  else {
    fVar2 = (((fVar1 + fVar1) * fVar2) / depth + fVar1 + fVar2) / (fVar1 - fVar2) + 1.0;
  }
  return (long)((float)(zmax - zmin) * fVar2 * 0.5) + zmin;
}

Assistant:

IMATH_CONSTEXPR14 long
Frustum<T>::DepthToZ (T depth, long zmin, long zmax) const IMATH_NOEXCEPT
{
    long zdiff        = zmax - zmin;
    T    farMinusNear = _farPlane - _nearPlane;

    if (_orthographic)
    {
        T farPlusNear = T (2) * depth + _farPlane + _nearPlane;

        T Zp = -farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
    else
    {
        // Perspective

        T farTimesNear = T (2) * _farPlane * _nearPlane;

        T farPlusNear = farTimesNear / depth + _farPlane + _nearPlane;

        T Zp = farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
}